

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

void minverse(double *A,int N,int *ipiv,double *inv)

{
  double *b;
  double *x;
  double *pdVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  b = (double *)malloc((long)N * 8);
  x = (double *)malloc((long)N * 8);
  if (0 < N) {
    uVar4 = (ulong)(uint)N;
    uVar3 = 0;
    memset(b,0,uVar4 * 8);
    memset(x,0,uVar4 * 8);
    do {
      b[uVar3] = 1.0;
      linsolve(A,N,b,ipiv,x);
      uVar2 = 0;
      pdVar1 = inv;
      do {
        *pdVar1 = x[uVar2];
        uVar2 = uVar2 + 1;
        pdVar1 = pdVar1 + uVar4;
      } while (uVar4 != uVar2);
      b[uVar3] = 0.0;
      uVar3 = uVar3 + 1;
      inv = inv + 1;
    } while (uVar3 != uVar4);
  }
  free(x);
  free(b);
  return;
}

Assistant:

void minverse(double *A,int N,int *ipiv,double *inv) {
	int i,j,stride;
	double *col,*x;
	
	col = (double*) malloc(sizeof(double) * N);
	x = (double*) malloc(sizeof(double) * N);
	
	for (i = 0; i < N; ++i) {
		col[i] = 0.;
		x[i] = 0.;
	}
	
	for (i = 0; i < N; ++i) {
		col[i] = 1.;
		linsolve(A,N,col,ipiv,x);
		stride = i;
		for(j = 0; j < N;++j) {
			inv[stride] = x[j];
			stride+= N;
		}
		col[i] = 0.;
	}
		
	free(x);
	free(col);
}